

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkLogicHasSimpleCos(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  char *__s2;
  Abc_Obj_t *pAVar8;
  int Fill;
  Vec_Ptr_t *pVVar9;
  Vec_Ptr_t *extraout_RDX;
  long lVar10;
  int iVar11;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x3b1,"int Abc_NtkLogicHasSimpleCos(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar5 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar5 + 500;
    iVar11 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar11) {
      piVar6 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar11;
    }
    if (-500 < iVar5) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar11;
  }
  iVar5 = pNtk->nTravIds;
  pNtk->nTravIds = iVar5 + 1;
  if (0x3ffffffe < iVar5) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    lVar10 = 0;
    do {
      pAVar8 = (Abc_Obj_t *)pVVar9->pArray[lVar10];
      if ((pAVar8->field_0x15 & 4) != 0) {
        return 0;
      }
      pAVar2 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray];
      uVar4 = *(uint *)&pAVar2->field_0x14 & 0xf;
      if ((uVar4 == 5) || (uVar4 == 2)) {
        pcVar7 = Abc_ObjName(pAVar2);
        __s2 = Abc_ObjName(pAVar8);
        iVar5 = strcmp(pcVar7,__s2);
        pVVar9 = extraout_RDX;
        if (iVar5 != 0) {
          return 0;
        }
      }
      pAVar3 = pAVar2->pNtk;
      iVar5 = pAVar2->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,(int)pVVar9);
      if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pAVar3->vTravIds).pArray[iVar5] == pAVar2->pNtk->nTravIds) {
        pAVar2 = pAVar2->pNext;
        pcVar7 = Abc_ObjName(pAVar8);
        iVar5 = strcmp((char *)pAVar2,pcVar7);
        if (iVar5 != 0) {
          return 0;
        }
      }
      else {
        pAVar8 = (Abc_Obj_t *)Abc_ObjName(pAVar8);
        pAVar2->pNext = pAVar8;
        pAVar3 = pAVar2->pNtk;
        iVar5 = pAVar3->nTravIds;
        iVar11 = pAVar2->Id;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar11 + 1,Fill);
        if (((long)iVar11 < 0) || ((pAVar3->vTravIds).nSize <= iVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar3->vTravIds).pArray[iVar11] = iVar5;
      }
      lVar10 = lVar10 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar10 < pVVar9->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkLogicHasSimpleCos( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pDriver;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        // if the driver is complemented, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjFaninC0(pNode) )
            return 0;
        // if the driver is a CI and has different name, this is an error
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
            return 0;
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
            return 0;
    }
    return 1;
}